

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.cpp
# Opt level: O1

JointIndex __thiscall
iDynTree::Model::addJointAndLink
          (Model *this,string *existingLink,string *jointName,IJointConstPtr joint,
          string *newLinkName,Link *newLink)

{
  pointer pcVar1;
  bool bVar2;
  LinkIndex LVar3;
  long *plVar4;
  JointIndex JVar5;
  size_type *psVar6;
  string error;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  string *local_88;
  IJointConstPtr local_80;
  Link *local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  pcVar1 = (existingLink->_M_dataplus)._M_p;
  local_88 = jointName;
  local_80 = joint;
  local_78 = newLink;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar1,pcVar1 + existingLink->_M_string_length);
  bVar2 = isLinkNameUsed(this,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if (bVar2) {
    LVar3 = addLink(this,newLinkName,local_78);
    if (LVar3 != LINK_INVALID_INDEX) {
      JVar5 = addJoint(this,existingLink,newLinkName,local_88,local_80);
      return JVar5;
    }
    std::operator+(&local_a8,"Error adding link of name ",newLinkName);
    iDynTree::reportError("Model","addJointAndLink",local_a8._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p == &local_a8.field_2) {
      return JOINT_INVALID_INDEX;
    }
  }
  else {
    std::operator+(&local_70,"a link of name ",existingLink);
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_70);
    psVar6 = (size_type *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar6) {
      local_a8.field_2._M_allocated_capacity = *psVar6;
      local_a8.field_2._8_8_ = plVar4[3];
      local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
    }
    else {
      local_a8.field_2._M_allocated_capacity = *psVar6;
      local_a8._M_dataplus._M_p = (pointer)*plVar4;
    }
    local_a8._M_string_length = plVar4[1];
    *plVar4 = (long)psVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    iDynTree::reportError("Model","addJointAndLink",local_a8._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p == &local_a8.field_2) {
      return JOINT_INVALID_INDEX;
    }
  }
  JVar5 = JOINT_INVALID_INDEX;
  operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
  return JVar5;
}

Assistant:

JointIndex Model::addJointAndLink(const std::string& existingLink,
                                  const std::string& jointName, IJointConstPtr joint,
                                  const std::string& newLinkName, Link& newLink)
{
    if( !(this->isLinkNameUsed(existingLink)) )
    {
        std::string error = "a link of name " + existingLink + " is not present in the model";
        reportError("Model","addJointAndLink",error.c_str());
        return JOINT_INVALID_INDEX;
    }

    LinkIndex newAddedLink = this->addLink(newLinkName,newLink);

    if( newAddedLink == LINK_INVALID_INDEX )
    {
        std::string error = "Error adding link of name " + newLinkName;
        reportError("Model","addJointAndLink",error.c_str());
        return JOINT_INVALID_INDEX;
    }

    return this->addJoint(existingLink,newLinkName,
                          jointName,joint);
}